

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

MTBDD mtbdd_cube(MTBDD variables,uint8_t *cube,MTBDD terminal)

{
  long *plVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  uint uVar5;
  MTBDD mtbdd;
  MTBDD MVar6;
  uint8_t *cube_00;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  
  cube_00 = cube + 1;
  puVar3 = nodes->data;
  while( true ) {
    uVar2 = cube_00[-1];
    lVar8 = (variables & 0xffffffffff) * 0x10;
    if (uVar2 != '\x02') break;
    cube_00 = cube_00 + 1;
    variables = variables & 0x8000000000000000 ^ *(ulong *)(puVar3 + lVar8) & 0x800000ffffffffff;
    if (variables == 0x8000000000000000) {
      return terminal;
    }
  }
  if (uVar2 != '\x03') {
    if (uVar2 == '\x01') {
      MVar6 = mtbdd_cube(variables & 0x8000000000000000 ^
                         *(ulong *)(puVar3 + lVar8) & 0x800000ffffffffff,cube_00,terminal);
      if (MVar6 != 0) {
        uVar5 = (uint)((ulong)*(undefined8 *)(puVar3 + lVar8 + 8) >> 0x20);
        mtbdd = 0;
        goto LAB_0011252f;
      }
    }
    else if ((uVar2 == '\0') &&
            (mtbdd = mtbdd_cube(variables & 0x8000000000000000 ^
                                *(ulong *)(puVar3 + lVar8) & 0x800000ffffffffff,cube_00,terminal),
            mtbdd != 0)) {
      MVar6 = 0;
      uVar5 = (uint)((ulong)*(undefined8 *)(puVar3 + lVar8 + 8) >> 0x20);
      goto LAB_0011252f;
    }
    return 0;
  }
  lVar7 = (*(ulong *)(puVar3 + lVar8) & 0xffffffffff) * 0x10;
  uVar4 = *(undefined8 *)(puVar3 + lVar7 + 8);
  MVar6 = mtbdd_cube((variables ^ *(ulong *)(puVar3 + lVar8)) & 0x8000000000000000 ^
                     *(ulong *)(puVar3 + lVar7) & 0x800000ffffffffff,cube_00 + 1,terminal);
  if (MVar6 == 0) {
    mtbdd_refs_push(0);
    plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
    *plVar1 = *plVar1 + -8;
    return 0;
  }
  uVar5 = (uint)((ulong)uVar4 >> 0x20);
  mtbdd = _mtbdd_makenode(uVar5 >> 8,MVar6,0);
  mtbdd_refs_push(mtbdd);
  MVar6 = _mtbdd_makenode(uVar5 >> 8,0,MVar6);
  plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
  *plVar1 = *plVar1 + -8;
  if (mtbdd == MVar6) {
    return mtbdd;
  }
  uVar5 = (uint)((ulong)*(undefined8 *)(puVar3 + lVar8 + 8) >> 0x20);
LAB_0011252f:
  MVar6 = _mtbdd_makenode(uVar5 >> 8,mtbdd,MVar6);
  return MVar6;
}

Assistant:

MTBDD
mtbdd_cube(MTBDD variables, uint8_t *cube, MTBDD terminal)
{
    if (variables == mtbdd_true) return terminal;
    mtbddnode_t n = MTBDD_GETNODE(variables);

    BDD result;
    switch (*cube) {
    case 0:
        result = mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
        result = mtbdd_makenode(mtbddnode_getvariable(n), result, mtbdd_false);
        return result;
    case 1:
        result = mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
        result = mtbdd_makenode(mtbddnode_getvariable(n), mtbdd_false, result);
        return result;
    case 2:
        return mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
    case 3:
    {
        MTBDD variables2 = node_gethigh(variables, n);
        mtbddnode_t n2 = MTBDD_GETNODE(variables2);
        uint32_t var2 = mtbddnode_getvariable(n2);
        result = mtbdd_cube(node_gethigh(variables2, n2), cube+2, terminal);
        BDD low = mtbdd_makenode(var2, result, mtbdd_false);
        mtbdd_refs_push(low);
        BDD high = mtbdd_makenode(var2, mtbdd_false, result);
        mtbdd_refs_pop(1);
        result = mtbdd_makenode(mtbddnode_getvariable(n), low, high);
        return result;
    }
    default:
        return mtbdd_false; // ?
    }
}